

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# silent_printf.cpp
# Opt level: O2

int Silent_WideCharToMultiByte
              (LPCWSTR lpWideCharStr,int cchWideChar,LPSTR lpMultiByteStr,int cbMultiByte)

{
  int iVar1;
  long lVar2;
  int iVar3;
  WCHAR WVar4;
  
  iVar1 = 0;
  if (lpWideCharStr != (LPCWSTR)lpMultiByteStr && lpWideCharStr != (LPCWSTR)0x0) {
    if (cchWideChar == -1) {
      for (lVar2 = 0; lpWideCharStr[lVar2] != L'\0'; lVar2 = lVar2 + 1) {
      }
      cchWideChar = (int)lVar2 + 1;
    }
    iVar1 = cchWideChar;
    if ((cbMultiByte != 0) && (iVar1 = 0, cchWideChar <= cbMultiByte)) {
      lVar2 = 0;
      for (iVar3 = cchWideChar; iVar1 = cchWideChar, 0 < iVar3; iVar3 = iVar3 + -1) {
        WVar4 = lpWideCharStr[lVar2];
        if (0xff < (ushort)lpWideCharStr[lVar2]) {
          WVar4 = L'?';
        }
        lpMultiByteStr[lVar2] = (CHAR)WVar4;
        lVar2 = lVar2 + 1;
      }
    }
  }
  return iVar1;
}

Assistant:

int Silent_WideCharToMultiByte(LPCWSTR lpWideCharStr, int cchWideChar,
                               LPSTR lpMultiByteStr, int cbMultiByte)
{
    INT retval =0;

    if ((lpWideCharStr == NULL)||
        (lpWideCharStr == (LPCWSTR) lpMultiByteStr))
    {
        goto EXIT;
    }

    if (cchWideChar == -1)
    {
        cchWideChar = Silent_PAL_wcslen(lpWideCharStr) + 1;
    }

    if (cbMultiByte == 0)
    {
        retval = cchWideChar;
        goto EXIT;
    }
    else if(cbMultiByte < cchWideChar)
    {
        retval = 0;
        goto EXIT;
    }
    
    retval = cchWideChar;
    while(cchWideChar > 0)
    {
        if(*lpWideCharStr > 255)
        {
            *lpMultiByteStr = '?';
        }
        else
        {
            *lpMultiByteStr = (unsigned char)*lpWideCharStr;
        }
        lpMultiByteStr++;
        lpWideCharStr++;
        cchWideChar--;
    }

EXIT:
    return retval;
}